

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::SchemaGrammar::putElemDecl
          (SchemaGrammar *this,XMLElementDecl *elemDecl,bool notDeclared)

{
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_00;
  XMLSize_t XVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,notDeclared) == 0) {
    this_00 = this->fElemDeclPool;
  }
  else {
    this_00 = this->fElemNonDeclPool;
    if (this_00 ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      this_00 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(this_00,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = this_00;
    }
  }
  XVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                    (this_00,elemDecl->fElementName->fLocalPart,elemDecl->fElementName->fURIId,
                     *(int *)((long)&elemDecl[1].super_XSerializable._vptr_XSerializable + 4),
                     (SchemaElementDecl *)elemDecl);
  return XVar1;
}

Assistant:

inline XMLSize_t
SchemaGrammar::putElemDecl(XMLElementDecl* const elemDecl,
                           const bool notDeclared)
{
    if (notDeclared)
    {
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        return fElemNonDeclPool->put(elemDecl->getBaseName(), elemDecl->getURI(), ((SchemaElementDecl* )elemDecl)->getEnclosingScope(), (SchemaElementDecl*) elemDecl);
    }

    return fElemDeclPool->put(elemDecl->getBaseName(), elemDecl->getURI(), ((SchemaElementDecl* )elemDecl)->getEnclosingScope(), (SchemaElementDecl*) elemDecl);
}